

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [9],MemorySizeFormatter<unsigned_long> *RestArgs,
               char (*RestArgs_1) [13],uint *RestArgs_2,char (*RestArgs_3) [28],
               MemorySizeFormatter<unsigned_long> *RestArgs_4)

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  FormatStrSS<std::__cxx11::stringstream,unsigned_long>(ss,RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}